

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  uint uVar1;
  pointer pcVar2;
  undefined3 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  BOM BVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  undefined7 uVar17;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  ostream *poVar16;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char cVar21;
  pointer pbVar22;
  uint uVar23;
  undefined1 uVar24;
  uint uVar25;
  ulong unaff_R13;
  ulong uVar26;
  int limit_output;
  string output;
  int limit_input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string outVar;
  string s;
  ifstream fin;
  RegularExpression regex;
  BOM local_554;
  uint local_540;
  int local_53c;
  ulong local_538;
  uint local_530;
  uint local_52c;
  string local_528;
  undefined8 local_508;
  int local_4fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  uint local_4d4;
  long *local_4d0;
  char *local_4c8;
  long local_4c0 [2];
  ulong local_4b0;
  string local_4a8;
  undefined1 local_488 [8];
  char *local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [6];
  ios_base local_418 [264];
  char *local_310;
  undefined1 local_308 [32];
  uint auStack_2e8 [20];
  ios_base local_298 [408];
  RegularExpression local_100;
  
  pbVar22 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    uVar24 = 0;
  }
  else {
    local_4d0 = local_4c0;
    pcVar2 = pbVar22[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,pcVar2,pcVar2 + pbVar22[1]._M_string_length);
    bVar5 = cmsys::SystemTools::FileIsFullPath((char *)local_4d0);
    if (!bVar5) {
      pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      pcVar15 = local_4c8;
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)&local_4d0,0,pcVar15,(ulong)pcVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     "/",(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::_M_append((char *)&local_4d0,local_308._0_8_);
      if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
        operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
      }
    }
    pbVar22 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    pcVar2 = pbVar22[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar2,pcVar2 + pbVar22[2]._M_string_length);
    local_4fc = -1;
    local_53c = -1;
    local_100.program = (char *)0x0;
    pbVar22 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22;
    bVar5 = 0x60 < uVar12;
    uVar17 = (undefined7)(uVar12 >> 8);
    if (bVar5) {
      local_538 = CONCAT44(local_538._4_4_,(int)CONCAT71(uVar17,1));
      uVar26 = 3;
      uVar19 = 4;
      local_554 = BOM_None;
      local_52c = 0;
      bVar4 = false;
      local_540 = 0;
      local_530 = 0;
      local_508 = (char *)((ulong)local_508._4_4_ << 0x20);
      uVar12 = 0;
LAB_0034e7f1:
      iVar7 = std::__cxx11::string::compare((char *)(pbVar22 + uVar26));
      if (iVar7 == 0) {
        uVar20 = 1;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 2;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 3;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 4;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 5;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 7;
        goto LAB_0034ed6a;
      }
      uVar13 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if ((int)uVar13 == 0) {
        local_52c = (uint)CONCAT71((int7)((ulong)uVar13 >> 8),1);
        uVar20 = 0;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      uVar20 = 0;
      if (iVar7 == 0) {
        local_538 = local_538 & 0xffffffff00000000;
        uVar20 = 0;
        goto LAB_0034ed6a;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar26));
      if (iVar7 == 0) {
        uVar20 = 8;
        goto LAB_0034ed6a;
      }
      uVar25 = (int)uVar12 - 1;
      uVar3 = (undefined3)(uVar25 >> 8);
      uVar23 = local_540;
      switch((ulong)uVar25) {
      case 0:
        uVar20 = 0;
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p,
                                "%d",&local_4fc);
        if ((iVar7 == 1) && (-1 < local_4fc)) goto LAB_0034ed6a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_INPUT value \"",0x22);
        pbVar22 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                             pbVar22[uVar26]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case 1:
        uVar20 = 0;
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p,
                                "%d",&local_53c);
        if ((iVar7 == 1) && (-1 < local_53c)) goto LAB_0034ed6a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_OUTPUT value \"",0x23);
        pbVar22 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                             pbVar22[uVar26]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case 2:
        uVar20 = 0;
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p,
                                "%d",&local_528);
        unaff_R13 = (ulong)CONCAT31(uVar3,-1 < (int)(uint)local_528._M_dataplus._M_p && iVar7 == 1);
        uVar23 = (uint)local_528._M_dataplus._M_p;
        uVar25 = local_530;
        if (-1 >= (int)(uint)local_528._M_dataplus._M_p || iVar7 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LIMIT_COUNT value \"",0x22);
          pbVar22 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                               pbVar22[uVar26]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar20 = 3;
          uVar23 = local_540;
          uVar25 = local_530;
        }
        goto LAB_0034ed61;
      case 3:
        uVar20 = 0;
        iVar8 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p,
                                "%d",&local_528);
        unaff_R13 = (ulong)CONCAT31(uVar3,-1 < (int)(uint)local_528._M_dataplus._M_p && iVar8 == 1);
        iVar7 = (uint)local_528._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_528._M_dataplus._M_p || iVar8 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MINIMUM value \"",0x25);
          pbVar22 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                               pbVar22[uVar26]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar20 = 4;
          iVar7 = (int)local_508;
        }
        local_508 = (char *)CONCAT44(local_508._4_4_,iVar7);
        uVar25 = local_530;
        goto LAB_0034ed61;
      case 4:
        uVar20 = 0;
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p,
                                "%d",&local_528);
        unaff_R13 = (ulong)CONCAT31(uVar3,-1 < (int)(uint)local_528._M_dataplus._M_p && iVar7 == 1);
        uVar25 = (uint)local_528._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_528._M_dataplus._M_p || iVar7 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MAXIMUM value \"",0x25);
          pbVar22 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                               pbVar22[uVar26]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar20 = 5;
          uVar25 = local_530;
        }
LAB_0034ed61:
        local_530 = uVar25;
        local_540 = uVar23;
        if ((char)unaff_R13 != '\0') goto LAB_0034ed6a;
        goto LAB_0034eded;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS given unknown argument \"",0x20);
        pbVar22 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                             pbVar22[uVar26]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case 6:
        bVar6 = cmsys::RegularExpression::compile
                          (&local_100,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p);
        if (bVar6) {
          bVar4 = true;
          goto LAB_0034ed6a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option REGEX value \"",0x1c);
        pbVar22 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                             pbVar22[uVar26]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" could not be compiled.",0x18)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case 7:
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar26));
        if (iVar7 == 0) {
          local_554 = BOM_UTF8;
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar26));
          if (iVar7 == 0) {
            local_554 = BOM_UTF16LE;
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar26));
            if (iVar7 == 0) {
              local_554 = BOM_UTF16BE;
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar26));
              if (iVar7 == 0) {
                local_554 = BOM_UTF32LE;
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar26));
                if (iVar7 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,"STRINGS option ENCODING \"",0x19);
                  pbVar22 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_308,pbVar22[uVar26]._M_dataplus._M_p,
                                       pbVar22[uVar26]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"\" not recognized.",0x11);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
                  break;
                }
                local_554 = BOM_UTF32BE;
                uVar20 = 0;
              }
            }
          }
        }
        goto LAB_0034ed6a;
      }
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,
                        CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                 local_478[0]._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      unaff_R13 = (ulong)uVar25;
      goto LAB_0034eded;
    }
    bVar4 = false;
    local_538 = CONCAT44(local_538._4_4_,(int)CONCAT71(uVar17,1));
    local_52c = 0;
    local_554 = BOM_None;
    local_508 = (char *)((ulong)local_508._4_4_ << 0x20);
    local_530 = 0;
    local_540 = 0;
LAB_0034eded:
    uVar19 = local_52c;
    if (bVar5) {
      uVar24 = 0;
    }
    else {
      if ((local_538 & 1) != 0) {
        pcVar15 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)local_308,pcVar15,(allocator *)local_488);
        std::__cxx11::string::append(local_308);
        std::__cxx11::string::append(local_308);
        bVar5 = cmHexFileConverter::TryConvert((char *)local_4d0,(char *)local_308._0_8_);
        if (bVar5) {
          std::__cxx11::string::_M_assign((string *)&local_4d0);
        }
        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
        }
      }
      std::ifstream::ifstream(local_308,(char *)local_4d0,_S_in);
      bVar5 = (*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) == 0;
      uVar12 = CONCAT71((int7)(unaff_R13 >> 8),bVar5);
      if (bVar5) {
        local_4d4 = (uint)uVar12;
        BVar9 = cmsys::FStream::ReadBOM((istream *)local_308);
        if (BVar9 == BOM_None) {
          BVar9 = local_554;
        }
        if (local_554 != BOM_None) {
          BVar9 = local_554;
        }
        uVar23 = 3;
        if ((BVar9 & ~BOM_UTF8) != BOM_UTF32BE) {
          uVar23 = (uint)((BVar9 & ~BOM_UTF8) == BOM_UTF16BE);
        }
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_488 = (undefined1  [8])local_478;
        local_480 = (char *)0x0;
        local_478[0]._M_local_buf[0] = '\0';
        local_4b0 = (ulong)local_540;
        local_508 = (char *)((ulong)local_508 & 0xffffffff);
        local_310 = (char *)(ulong)local_530;
        uVar12 = 0;
        do {
          if ((((local_540 != 0) &&
               (local_4b0 <=
                (ulong)((long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5))) ||
              ((-1 < local_4fc && (iVar7 = std::istream::tellg(), local_4fc <= iVar7)))) ||
             ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)) break;
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
          local_528._M_string_length = 0;
          local_528.field_2._M_local_buf[0] = '\0';
          local_538 = uVar12;
          uVar25 = std::istream::get();
          cVar21 = (char)local_308;
          if (uVar23 != 0) {
            uVar18 = 1;
            do {
              uVar10 = std::istream::get();
              uVar1 = *(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18));
              if ((uVar1 & 5) == 0) {
                uVar25 = uVar25 << 8 | uVar10;
              }
              else {
                std::istream::putback(cVar21);
              }
            } while (((uVar1 & 5) == 0) && (bVar5 = uVar18 < uVar23, uVar18 = uVar18 + 1, bVar5));
          }
          if (BVar9 == BOM_UTF32LE) {
            uVar25 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                     uVar25 << 0x18;
          }
          else if (BVar9 == BOM_UTF16LE) {
            uVar25 = (uint)(ushort)((ushort)uVar25 << 8 | (ushort)uVar25 >> 8);
          }
          if (uVar25 == 0xd) {
LAB_0034f47c:
            bVar5 = false;
          }
          else {
            if ((byte)(uVar25 == 10 & (byte)uVar19 | (uVar25 == 9 || uVar25 - 0x20 < 0x5f)) == 1) {
              std::__cxx11::string::push_back((char)&local_528);
            }
            else if (BVar9 == BOM_UTF8) {
              uVar12 = 0;
              do {
                uVar19 = HandleStringsCommand::utf8_check_table[uVar12][0] & uVar25;
                uVar26 = uVar12 + 1;
                uVar18 = (uint)HandleStringsCommand::utf8_check_table[uVar12][1];
                if (uVar19 == uVar18) break;
                bVar5 = uVar12 < 2;
                uVar12 = uVar26;
              } while (bVar5);
              uVar1 = (int)uVar26 + 1;
              if (uVar19 != uVar18) {
                uVar1 = 0;
              }
              if (uVar19 == uVar18) {
                iVar7 = 0;
                do {
                  if ((iVar7 != 0) &&
                     ((uVar25 = std::istream::get(), (uVar25 & 0xc0) != 0x80 ||
                      ((*(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)
                      ))) {
                    std::istream::putback(cVar21);
                    break;
                  }
                  std::__cxx11::string::push_back((char)&local_528);
                  iVar7 = iVar7 + 1;
                } while (uVar1 + (uVar1 == 0) != iVar7);
              }
              uVar19 = local_52c;
              if ((char *)local_528._M_string_length != (char *)(ulong)uVar1) {
                if ((char *)local_528._M_string_length != (char *)0x1) {
                  pcVar15 = (char *)0x0;
                  pcVar11 = (char *)0x1;
                  do {
                    uVar25 = (uint)((char *)(local_528._M_string_length +
                                            (long)local_528._M_dataplus._M_p))[~(ulong)pcVar15];
                    std::istream::putback(cVar21);
                    bVar5 = pcVar11 < (char *)(local_528._M_string_length + -1);
                    pcVar15 = pcVar11;
                    pcVar11 = (char *)(ulong)((int)pcVar11 + 1);
                  } while (bVar5);
                }
                std::__cxx11::string::_M_replace
                          ((ulong)&local_528,0,(char *)local_528._M_string_length,0x5f2b3e);
              }
            }
            if (uVar25 == 10 && (uVar19 & 1) == 0) {
              if ((local_480 < local_508) ||
                 ((bVar4 && (bVar5 = cmsys::RegularExpression::find(&local_100,(char *)local_488),
                            !bVar5)))) {
LAB_0034f3af:
                std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
                goto LAB_0034f3fd;
              }
              uVar25 = (int)local_538 + (int)local_480 + 1;
              local_538 = (ulong)uVar25;
              if ((local_53c < 0) || ((int)uVar25 < local_53c)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
                goto LAB_0034f3af;
              }
              bVar5 = true;
              std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
            }
            else {
              if ((char *)local_528._M_string_length == (char *)0x0) {
                if ((local_480 != (char *)0x0 && local_508 <= local_480) &&
                   ((!bVar4 ||
                    (bVar5 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar5))))
                {
                  uVar25 = (int)local_538 + (int)local_480 + 1;
                  local_538 = (ulong)uVar25;
                  if ((-1 < local_53c) && (local_53c <= (int)uVar25)) {
                    bVar5 = true;
                    std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
                    goto LAB_0034f47e;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_4f8,(value_type *)local_488);
                }
                std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
              }
              else {
                std::__cxx11::string::_M_append(local_488,(ulong)local_528._M_dataplus._M_p);
              }
LAB_0034f3fd:
              if ((local_530 == 0) || (local_480 != local_310)) goto LAB_0034f47c;
              if ((local_508 <= local_480) &&
                 ((!bVar4 ||
                  (bVar5 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar5)))) {
                uVar25 = (int)local_538 + (int)local_480 + 1;
                local_538 = (ulong)uVar25;
                if ((-1 < local_53c) && (local_53c <= (int)uVar25)) {
                  bVar5 = true;
                  std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
                  goto LAB_0034f47e;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
              }
              bVar5 = false;
              std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x5f2b3e);
            }
          }
LAB_0034f47e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,
                            CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                                     local_528.field_2._M_local_buf[0]) + 1);
          }
          uVar12 = local_538;
        } while (!bVar5);
        if (((((local_540 == 0) ||
              ((ulong)((long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) < local_4b0)) &&
             (local_480 != (char *)0x0)) &&
            ((local_508 <= local_480 &&
             ((!bVar4 ||
              (bVar5 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar5)))))) &&
           ((local_53c < 0 || ((int)local_480 + (int)uVar12 + 1 < local_53c)))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4f8,(value_type *)local_488);
        }
        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        local_528._M_string_length = 0;
        local_528.field_2._M_local_buf[0] = '\0';
        uVar12 = (ulong)local_4d4;
        if (local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar22 = local_4f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__cxx11::string::append((char *)&local_528);
            if (pbVar22->_M_string_length != 0) {
              uVar19 = 1;
              uVar26 = 0;
              do {
                cVar21 = (char)&local_528;
                if ((pbVar22->_M_dataplus)._M_p[uVar26] == ';') {
                  std::__cxx11::string::push_back(cVar21);
                }
                std::__cxx11::string::push_back(cVar21);
                uVar26 = (ulong)uVar19;
                uVar19 = uVar19 + 1;
              } while (uVar26 < pbVar22->_M_string_length);
            }
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 !=
                   local_4f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_4a8,local_528._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,
                          CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                                   local_528.field_2._M_local_buf[0]) + 1);
        }
        if (local_488 != (undefined1  [8])local_478) {
          operator_delete((void *)local_488,
                          CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                   local_478[0]._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4f8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_488,"STRINGS file \"",0xe);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,(char *)local_4d0,(long)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" cannot be read.",0x11);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,
                          CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                                   local_528.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
        std::ios_base::~ios_base(local_418);
      }
      uVar24 = (undefined1)uVar12;
      std::ifstream::~ifstream(local_308);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if (local_4d0 != local_4c0) {
      operator_delete(local_4d0,local_4c0[0] + 1);
    }
  }
  return (bool)uVar24;
LAB_0034ed6a:
  uVar26 = (ulong)uVar19;
  pbVar22 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22 >> 5;
  uVar19 = uVar19 + 1;
  bVar5 = uVar26 < uVar14;
  unaff_R13 = uVar20;
  uVar12 = uVar20;
  if (uVar14 <= uVar26) goto LAB_0034eded;
  goto LAB_0034e7f1;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName.c_str())) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
  }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg__maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i].c_str())) {
        std::ostringstream e;
        e << "STRINGS option REGEX value \"" << args[i]
          << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        std::ostringstream e;
        e << "STRINGS option ENCODING \"" << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else {
      std::ostringstream e;
      e << "STRINGS given unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += cmake::GetCMakeFilesDirectory();
    binaryFileName += "/FileCommandStringsBinaryFile";
    if (cmHexFileConverter::TryConvert(fileName.c_str(),
                                       binaryFileName.c_str())) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if ((c >= 0x20 && c < 0x7F) || c == '\t' ||
        (c == '\n' && newline_consume)) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 }, { 0xF0, 0xE0 }, { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
        }
        current_str = "";
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s.c_str()))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s = "";
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s = "";
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s.c_str()))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s = "";
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s = "";
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s.c_str()))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s = "";
          break;
        }
        strings.push_back(s);
      }
      s = "";
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s.c_str()))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::vector<std::string>::const_iterator si = strings.begin();
       si != strings.end(); ++si) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    std::string const& sr = *si;
    for (unsigned int i = 0; i < sr.size(); ++i) {
      if (sr[i] == ';') {
        output += '\\';
      }
      output += sr[i];
    }
  }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}